

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprintpreviewdialog.cpp
# Opt level: O1

void QPrintPreviewDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPrintPreviewDialogPrivate *this;
  undefined8 *puVar1;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (((_id == 1) || (_id == 4)) || (_id == 5)) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        goto LAB_0014c108;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
  }
  else if (_c == IndexOfMethod) {
    if ((*_a[1] == paintRequested) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_40 = *_a[1];
      puStack_30 = &local_40;
      local_38 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
      break;
    case 1:
      QPrintPreviewDialogPrivate::_q_fit(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
      break;
    case 2:
      QPrintPreviewDialogPrivate::_q_zoomIn(*(QPrintPreviewDialogPrivate **)(_o + 8));
      break;
    case 3:
      QPrintPreviewDialogPrivate::_q_zoomOut(*(QPrintPreviewDialogPrivate **)(_o + 8));
      break;
    case 4:
      QPrintPreviewDialogPrivate::_q_navigate(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
      break;
    case 5:
      QPrintPreviewDialogPrivate::_q_setMode(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
      break;
    case 6:
      QPrintPreviewDialogPrivate::_q_pageNumEdited(*(QPrintPreviewDialogPrivate **)(_o + 8));
      break;
    case 7:
      QPrintPreviewDialogPrivate::_q_print(*(QPrintPreviewDialogPrivate **)(_o + 8));
      break;
    case 8:
      QPrintPreviewDialogPrivate::_q_pageSetup(*(QPrintPreviewDialogPrivate **)(_o + 8));
      break;
    case 9:
      this = *(QPrintPreviewDialogPrivate **)(_o + 8);
      QPrintPreviewDialogPrivate::updateNavActions(this);
      QPrintPreviewDialogPrivate::updatePageNumLabel(this);
      QPrintPreviewDialogPrivate::updateZoomFactor(this);
      break;
    case 10:
      QPrintPreviewDialogPrivate::_q_zoomFactorChanged(*(QPrintPreviewDialogPrivate **)(_o + 8));
    }
  }
LAB_0014c108:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrintPreviewDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPrintPreviewDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->paintRequested((*reinterpret_cast< std::add_pointer_t<QPrinter*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_fit((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 2: _t->d_func()->_q_zoomIn(); break;
        case 3: _t->d_func()->_q_zoomOut(); break;
        case 4: _t->d_func()->_q_navigate((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 5: _t->d_func()->_q_setMode((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 6: _t->d_func()->_q_pageNumEdited(); break;
        case 7: _t->d_func()->_q_print(); break;
        case 8: _t->d_func()->_q_pageSetup(); break;
        case 9: _t->d_func()->_q_previewChanged(); break;
        case 10: _t->d_func()->_q_zoomFactorChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPrintPreviewDialog::*)(QPrinter * )>(_a, &QPrintPreviewDialog::paintRequested, 0))
            return;
    }
}